

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O0

void highbd_hfilter8(uint16_t *src,int src_stride,int16_t *dst,int w,int h,int subpel_x_qn,
                    int x_step_qn,InterpFilterParams *filter_params,int round,int bd)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  long lVar7;
  undefined1 (*pauVar8) [16];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int k;
  int32_t sum;
  uint16_t *src_row;
  __m128i shifted;
  __m128i conv;
  __m128i conv23lo;
  __m128i conv01lo;
  __m128i conv3lo;
  __m128i conv2lo;
  __m128i conv1lo;
  __m128i conv0lo;
  __m128i data3lo;
  __m128i data2lo;
  __m128i data1lo;
  __m128i data0lo;
  uint16_t *src3;
  uint16_t *src2;
  uint16_t *src1;
  uint16_t *src0;
  int y;
  __m128i coefflo;
  int16_t *filter;
  int filter_idx;
  uint16_t *src_col;
  int x;
  int x_qn;
  __m128i round_shift;
  __m128i round_add;
  int32_t round_add32;
  int ntaps;
  int local_358;
  int local_354;
  undefined8 local_348;
  undefined8 uStack_340;
  int local_25c;
  int local_230;
  uint local_22c;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  
  iVar6 = (1 << ((byte)shifted[1] & 0x1f)) / 2 + (1 << ((char)conv[0] + 6U & 0x1f));
  local_22c = in_R9D;
  for (local_230 = 0; local_230 < in_ECX; local_230 = local_230 + 1) {
    lVar7 = in_RDI + -6 + (long)((int)local_22c >> 10) * 2;
    pauVar8 = (undefined1 (*) [16])
              av1_get_interp_filter_subpel_kernel
                        ((InterpFilterParams *)shifted[0],(int)(local_22c & 0x3ff) >> 6);
    auVar5 = *pauVar8;
    auVar4 = *pauVar8;
    auVar3 = *pauVar8;
    auVar2 = *pauVar8;
    for (local_25c = 0; local_25c <= in_R8D + -4; local_25c = local_25c + 4) {
      pauVar1 = (undefined1 (*) [16])(lVar7 + (long)(local_25c * in_ESI) * 2);
      auVar9 = pmaddwd(*pauVar1,auVar2);
      auVar10 = pmaddwd(*(undefined1 (*) [16])(*pauVar1 + (long)in_ESI * 2),auVar3);
      auVar11 = pmaddwd(*(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI * 2) * 2),auVar4);
      auVar12 = pmaddwd(*(undefined1 (*) [16])(*pauVar1 + (long)(in_ESI * 3) * 2),auVar5);
      auVar9 = phaddd(auVar9,auVar10);
      auVar10 = phaddd(auVar11,auVar12);
      auVar9 = phaddd(auVar9,auVar10);
      local_78 = auVar9._0_4_;
      iStack_74 = auVar9._4_4_;
      iStack_70 = auVar9._8_4_;
      iStack_6c = auVar9._12_4_;
      auVar9 = ZEXT416((uint)shifted[1]);
      local_348 = CONCAT44(iStack_74 + iVar6 >> auVar9,local_78 + iVar6 >> auVar9);
      uStack_340._0_4_ = iStack_70 + iVar6 >> auVar9;
      uStack_340._4_4_ = iStack_6c + iVar6 >> auVar9;
      auVar10._8_8_ = uStack_340;
      auVar10._0_8_ = local_348;
      auVar9._8_8_ = uStack_340;
      auVar9._0_8_ = local_348;
      auVar9 = packusdw(auVar10,auVar9);
      local_348 = auVar9._0_8_;
      *(undefined8 *)(in_RDX + (long)local_25c * 2 + (long)(local_230 * in_R8D) * 2) = local_348;
    }
    for (; local_25c < in_R8D; local_25c = local_25c + 1) {
      local_354 = 1 << ((char)conv[0] + 6U & 0x1f);
      for (local_358 = 0; local_358 < 8; local_358 = local_358 + 1) {
        local_354 = (int)*(short *)(*pauVar8 + (long)local_358 * 2) *
                    (uint)*(ushort *)(lVar7 + (long)(local_25c * in_ESI) * 2 + (long)local_358 * 2)
                    + local_354;
      }
      *(short *)(in_RDX + (long)(local_25c + local_230 * in_R8D) * 2) =
           (short)(local_354 + ((1 << ((byte)shifted[1] & 0x1f)) >> 1) >> ((byte)shifted[1] & 0x1f))
      ;
    }
    local_22c = (int)src_row + local_22c;
  }
  return;
}

Assistant:

static void highbd_hfilter8(const uint16_t *src, int src_stride, int16_t *dst,
                            int w, int h, int subpel_x_qn, int x_step_qn,
                            const InterpFilterParams *filter_params, int round,
                            int bd) {
  const int ntaps = 8;

  src -= ntaps / 2 - 1;

  int32_t round_add32 = (1 << round) / 2 + (1 << (bd + FILTER_BITS - 1));
  const __m128i round_add = _mm_set1_epi32(round_add32);
  const __m128i round_shift = _mm_cvtsi32_si128(round);

  int x_qn = subpel_x_qn;
  for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
    const uint16_t *const src_col = src + (x_qn >> SCALE_SUBPEL_BITS);
    const int filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
    assert(filter_idx < SUBPEL_SHIFTS);
    const int16_t *filter =
        av1_get_interp_filter_subpel_kernel(filter_params, filter_idx);

    // Load the filter coefficients
    const __m128i coefflo = _mm_loadu_si128((__m128i *)filter);

    int y;
    for (y = 0; y <= h - 4; y += 4) {
      const uint16_t *const src0 = src_col + y * src_stride;
      const uint16_t *const src1 = src0 + 1 * src_stride;
      const uint16_t *const src2 = src0 + 2 * src_stride;
      const uint16_t *const src3 = src0 + 3 * src_stride;

      // Load up source data. This is 16-bit input data, so each load gets the 8
      // pixels we need.
      const __m128i data0lo = _mm_loadu_si128((__m128i *)src0);
      const __m128i data1lo = _mm_loadu_si128((__m128i *)src1);
      const __m128i data2lo = _mm_loadu_si128((__m128i *)src2);
      const __m128i data3lo = _mm_loadu_si128((__m128i *)src3);

      // Multiply by coefficients
      const __m128i conv0lo = _mm_madd_epi16(data0lo, coefflo);
      const __m128i conv1lo = _mm_madd_epi16(data1lo, coefflo);
      const __m128i conv2lo = _mm_madd_epi16(data2lo, coefflo);
      const __m128i conv3lo = _mm_madd_epi16(data3lo, coefflo);

      // Reduce horizontally and add
      const __m128i conv01lo = _mm_hadd_epi32(conv0lo, conv1lo);
      const __m128i conv23lo = _mm_hadd_epi32(conv2lo, conv3lo);
      const __m128i conv = _mm_hadd_epi32(conv01lo, conv23lo);

      // Divide down by (1 << round), rounding to nearest.
      __m128i shifted =
          _mm_sra_epi32(_mm_add_epi32(conv, round_add), round_shift);

      shifted = _mm_packus_epi32(shifted, shifted);
      // Write transposed to the output
      _mm_storel_epi64((__m128i *)(dst + y + x * h), shifted);
    }
    for (; y < h; ++y) {
      const uint16_t *const src_row = src_col + y * src_stride;

      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < ntaps; ++k) {
        sum += filter[k] * src_row[k];
      }

      dst[y + x * h] = ROUND_POWER_OF_TWO(sum, round);
    }
  }
}